

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ym2608_set_mute_mask(void *chip,UINT32 MuteMask)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)chip + 0x4908;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    *(bool *)lVar2 = (MuteMask >> ((uint)lVar3 & 0x1f) & 1) != 0;
    lVar2 = lVar2 + 0x198;
  }
  uVar1 = 6;
  for (lVar2 = 0; lVar2 != 0x180; lVar2 = lVar2 + 0x40) {
    *(bool *)((long)chip + lVar2 + 0x5158) = (MuteMask >> (uVar1 & 0x1f) & 1) != 0;
    uVar1 = uVar1 + 1;
  }
  *(byte *)((long)chip + 0x5408) = (byte)(MuteMask >> 0xc) & 1;
  return;
}

Assistant:

void ym2608_set_mute_mask(void *chip, UINT32 MuteMask)
{
	YM2608 *F2608 = (YM2608 *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 6; CurChn ++)
		F2608->CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 6; CurChn ++)
		F2608->adpcm[CurChn].Muted = (MuteMask >> (CurChn + 6)) & 0x01;
	F2608->MuteDeltaT = (MuteMask >> 12) & 0x01;
	
	return;
}